

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::xpression_linker<char>::
alt_branch_link<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (xpression_linker<char> *this,
          shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *xpr,void *next,xpression_peeker<char> *peeker)

{
  stack<const_void_*,_std::deque<const_void_*,_std::allocator<const_void_*>_>_> *in_RCX;
  char *__to;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  xpression_peeker<char> *in_RDI;
  
  std::stack<const_void_*,_std::deque<const_void_*,_std::allocator<const_void_*>_>_>::push
            (in_RCX,&in_RDI->bset_);
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::link(in_RSI,(char *)in_RDI,__to);
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::peek((shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RCX,in_RDI);
  return;
}

Assistant:

void alt_branch_link(Xpr const &xpr, void const *next, xpression_peeker<Char> *peeker)
    {
        this->back_stack_.push(next);
        xpr.link(*this);
        xpr.peek(*peeker);
    }